

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O1

void crnlib::MatchFinder_CreateVTable(CMatchFinder *p,IMatchFinder *vTable)

{
  code *pcVar1;
  
  vTable->Init = MatchFinder_Init;
  vTable->GetIndexByte = MatchFinder_GetIndexByte;
  vTable->GetNumAvailableBytes = MatchFinder_GetNumAvailableBytes;
  vTable->GetPointerToCurrentPos = MatchFinder_GetPointerToCurrentPos;
  if (p->btMode == 0) {
    vTable->GetMatches = Hc4_MatchFinder_GetMatches;
    pcVar1 = Hc4_MatchFinder_Skip;
  }
  else if (p->numHashBytes == 3) {
    vTable->GetMatches = Bt3_MatchFinder_GetMatches;
    pcVar1 = Bt3_MatchFinder_Skip;
  }
  else if (p->numHashBytes == 2) {
    vTable->GetMatches = Bt2_MatchFinder_GetMatches;
    pcVar1 = Bt2_MatchFinder_Skip;
  }
  else {
    vTable->GetMatches = Bt4_MatchFinder_GetMatches;
    pcVar1 = Bt4_MatchFinder_Skip;
  }
  vTable->Skip = pcVar1;
  return;
}

Assistant:

void MatchFinder_CreateVTable(CMatchFinder* p, IMatchFinder* vTable) {
  vTable->Init = (Mf_Init_Func)MatchFinder_Init;
  vTable->GetIndexByte = (Mf_GetIndexByte_Func)MatchFinder_GetIndexByte;
  vTable->GetNumAvailableBytes = (Mf_GetNumAvailableBytes_Func)MatchFinder_GetNumAvailableBytes;
  vTable->GetPointerToCurrentPos = (Mf_GetPointerToCurrentPos_Func)MatchFinder_GetPointerToCurrentPos;
  if (!p->btMode) {
    vTable->GetMatches = (Mf_GetMatches_Func)Hc4_MatchFinder_GetMatches;
    vTable->Skip = (Mf_Skip_Func)Hc4_MatchFinder_Skip;
  } else if (p->numHashBytes == 2) {
    vTable->GetMatches = (Mf_GetMatches_Func)Bt2_MatchFinder_GetMatches;
    vTable->Skip = (Mf_Skip_Func)Bt2_MatchFinder_Skip;
  } else if (p->numHashBytes == 3) {
    vTable->GetMatches = (Mf_GetMatches_Func)Bt3_MatchFinder_GetMatches;
    vTable->Skip = (Mf_Skip_Func)Bt3_MatchFinder_Skip;
  } else {
    vTable->GetMatches = (Mf_GetMatches_Func)Bt4_MatchFinder_GetMatches;
    vTable->Skip = (Mf_Skip_Func)Bt4_MatchFinder_Skip;
  }
}